

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int32_t mipsdsp_sat16_mul_i16_i16(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  undefined4 local_1c;
  int32_t temp;
  CPUMIPSState_conflict5 *env_local;
  int16_t b_local;
  int16_t a_local;
  
  local_1c = (int)a * (int)b;
  if ((int)local_1c < 0x8000) {
    if ((int)local_1c < -0x8000) {
      local_1c = 0xffff8000;
      set_DSPControl_overflow_flag(1,0x15,env);
    }
  }
  else {
    local_1c = 0x7fff;
    set_DSPControl_overflow_flag(1,0x15,env);
  }
  return local_1c & 0xffff;
}

Assistant:

static inline int32_t mipsdsp_sat16_mul_i16_i16(int16_t a, int16_t b,
                                                CPUMIPSState *env)
{
    int32_t temp;

    temp = (int32_t)a * (int32_t)b;

    if (temp > (int)0x7FFF) {
        temp = 0x00007FFF;
        set_DSPControl_overflow_flag(1, 21, env);
    } else if (temp < (int)0xffff8000) {
        temp = 0xFFFF8000;
        set_DSPControl_overflow_flag(1, 21, env);
    }
    temp &= 0x0000FFFF;

    return temp;
}